

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O0

void __thiscall
MlCalciumChannel::MlCalciumChannel
          (MlCalciumChannel *this,double weight,double reversal,string *name,string *type)

{
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_b9;
  string local_b8;
  Unit local_98;
  string *local_30;
  string *type_local;
  string *name_local;
  double reversal_local;
  double weight_local;
  MlCalciumChannel *this_local;
  
  local_30 = type;
  type_local = name;
  name_local = (string *)reversal;
  reversal_local = weight;
  weight_local = (double)this;
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__MlCalciumChannel_0018f868;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__MlCalciumChannel_0018f918;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__MlCalciumChannel_0018f960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"m",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"V",&local_f1);
  Unit::Unit(&local_98,&local_b8,&local_f0);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,&local_98);
  Unit::~Unit(&local_98);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"reversal-potential",&local_119);
  Parametric::addParameter((Parametric *)this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"weight",&local_141);
  Parametric::addParameter((Parametric *)this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

MlCalciumChannel::MlCalciumChannel(double weight, double reversal, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	physicalUnit = Unit("m","V");
	addParameter("reversal-potential");
	addParameter("weight");
}